

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ir.c
# Opt level: O0

TRef lj_ir_knull(jit_State *J,IRType t)

{
  ushort uVar1;
  IRIns *pIVar2;
  uint in_ESI;
  jit_State *in_RDI;
  IRRef ref;
  IRIns *cir;
  IRIns *ir;
  IRRef ref_1;
  uint local_34;
  jit_State *pjVar3;
  
  pIVar2 = (in_RDI->cur).ir;
  uVar1 = in_RDI->chain[0x1a];
  while (local_34 = (uint)uVar1, local_34 != 0) {
    if (*(byte *)((long)pIVar2 + (ulong)local_34 * 8 + 4) == in_ESI) goto LAB_00145bc7;
    uVar1 = *(ushort *)((long)pIVar2 + (ulong)local_34 * 8 + 6);
  }
  local_34 = (in_RDI->cur).nk;
  pjVar3 = in_RDI;
  if (local_34 <= in_RDI->irbotlim) {
    lj_ir_growbot(in_RDI);
  }
  local_34 = local_34 - 1;
  (in_RDI->cur).nk = local_34;
  pIVar2 = (pjVar3->cur).ir + local_34;
  (pIVar2->field_1).op12 = 0;
  (pIVar2->field_1).t.irt = (uint8_t)in_ESI;
  (pIVar2->field_1).o = '\x1a';
  (pIVar2->field_0).prev = pjVar3->chain[0x1a];
  pjVar3->chain[0x1a] = (IRRef1)local_34;
LAB_00145bc7:
  return local_34 + in_ESI * 0x1000000;
}

Assistant:

TRef lj_ir_knull(jit_State *J, IRType t)
{
  IRIns *ir, *cir = J->cur.ir;
  IRRef ref;
  for (ref = J->chain[IR_KNULL]; ref; ref = cir[ref].prev)
    if (irt_t(cir[ref].t) == t)
      goto found;
  ref = ir_nextk(J);
  ir = IR(ref);
  ir->i = 0;
  ir->t.irt = (uint8_t)t;
  ir->o = IR_KNULL;
  ir->prev = J->chain[IR_KNULL];
  J->chain[IR_KNULL] = (IRRef1)ref;
found:
  return TREF(ref, t);
}